

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_or(t_parser *this,bool a_assignable)

{
  bool bVar1;
  t_token tVar2;
  t_at *ptVar3;
  t_binary *this_00;
  undefined7 in_register_00000031;
  long lVar4;
  bool bVar5;
  undefined1 local_50 [16];
  t_at at;
  bool a_assignable_local;
  t_parser *this_local;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *node;
  
  lVar4 = CONCAT71(in_register_00000031,a_assignable);
  f_xor(this,a_assignable);
  while( true ) {
    bVar1 = t_lexer::f_newline((t_lexer *)(lVar4 + 8));
    bVar5 = false;
    if (!bVar1) {
      tVar2 = t_lexer::f_token((t_lexer *)(lVar4 + 8));
      bVar5 = tVar2 == c_token__BAR;
    }
    if (!bVar5) break;
    ptVar3 = t_lexer::f_at((t_lexer *)(lVar4 + 8));
    at.v_line = ptVar3->v_column;
    local_50._8_8_ = ptVar3->v_position;
    at.v_position = ptVar3->v_line;
    t_lexer::f_next((t_lexer *)(lVar4 + 8));
    this_00 = (t_binary *)operator_new(0x38);
    f_xor((t_parser *)local_50,a_assignable);
    ast::t_binary::t_binary
              (this_00,(t_at *)(local_50 + 8),c_instruction__OR_TT,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)this,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_50);
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::reset
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)this,
               (pointer)this_00);
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_50);
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_or(bool a_assignable)
{
	auto node = f_xor(a_assignable);
	while (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__BAR) {
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		node.reset(new ast::t_binary(at, c_instruction__OR_TT, std::move(node), f_xor(false)));
	}
	return node;
}